

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

int stbir_resize_subpixel
              (void *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
              void *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
              stbir_datatype datatype,int num_channels,int alpha_channel,int flags,
              stbir_edge edge_mode_horizontal,stbir_edge edge_mode_vertical,
              stbir_filter filter_horizontal,stbir_filter filter_vertical,stbir_colorspace space,
              void *alloc_context,float x_scale,float y_scale,float x_offset,float y_offset)

{
  int iVar1;
  float local_78;
  float local_74;
  float transform [4];
  float y_offset_local;
  float x_offset_local;
  float y_scale_local;
  float x_scale_local;
  int output_w_local;
  void *output_pixels_local;
  int input_stride_in_bytes_local;
  int input_h_local;
  int input_w_local;
  void *input_pixels_local;
  
  local_78 = x_scale;
  local_74 = y_scale;
  transform[0] = x_offset;
  transform[1] = y_offset;
  transform[3] = y_offset;
  iVar1 = stbir__resize_arbitrary
                    (alloc_context,input_pixels,input_w,input_h,input_stride_in_bytes,output_pixels,
                     output_w,output_h,output_stride_in_bytes,0.0,0.0,1.0,1.0,&local_78,num_channels
                     ,alpha_channel,flags,datatype,filter_horizontal,filter_vertical,
                     edge_mode_horizontal,edge_mode_vertical,space);
  return iVar1;
}

Assistant:

STBIRDEF int stbir_resize_subpixel(const void *input_pixels , int input_w , int input_h , int input_stride_in_bytes,
                                         void *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                                   stbir_datatype datatype,
                                   int num_channels, int alpha_channel, int flags,
                                   stbir_edge edge_mode_horizontal, stbir_edge edge_mode_vertical,
                                   stbir_filter filter_horizontal,  stbir_filter filter_vertical,
                                   stbir_colorspace space, void *alloc_context,
                                   float x_scale, float y_scale,
                                   float x_offset, float y_offset)
{
    float transform[4];
    transform[0] = x_scale;
    transform[1] = y_scale;
    transform[2] = x_offset;
    transform[3] = y_offset;
    return stbir__resize_arbitrary(alloc_context, input_pixels, input_w, input_h, input_stride_in_bytes,
        output_pixels, output_w, output_h, output_stride_in_bytes,
        0,0,1,1,transform,num_channels,alpha_channel,flags, datatype, filter_horizontal, filter_vertical,
        edge_mode_horizontal, edge_mode_vertical, space);
}